

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

bool_t memIsZero_fast(void *buf,size_t count)

{
  size_t count_local;
  void *buf_local;
  
  buf_local = buf;
  for (count_local = count; 7 < count_local; count_local = count_local - 8) {
    if (*buf_local != 0) {
      return 0;
    }
    buf_local = (void *)((long)buf_local + 8);
  }
  while( true ) {
    if (count_local == 0) {
      return 1;
    }
    if (*buf_local != '\0') break;
    buf_local = (void *)((long)buf_local + 1);
    count_local = count_local - 1;
  }
  return 0;
}

Assistant:

bool_t FAST(memIsZero)(const void* buf, size_t count)
{
	ASSERT(memIsValid(buf, count));
	for (; count >= O_PER_W; count -= O_PER_W, buf = (const word*)buf + 1)
		if (*(const word*)buf)
			return FALSE;
	for (; count--; buf = (const octet*)buf + 1)
		if (*(const octet*)buf)
			return FALSE;
	return TRUE;
}